

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O0

void nn_xreq_out(nn_sockbase *self,nn_pipe *pipe)

{
  nn_pipe *in_RSI;
  nn_sockbase *in_RDI;
  nn_xreq_data *data;
  nn_xreq *xreq;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  nn_lb *in_stack_ffffffffffffffd0;
  
  nn_pipe_getdata(in_RSI);
  nn_lb_out(in_stack_ffffffffffffffd0,
            (nn_lb_data *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  nn_lb_get_priority((nn_lb *)0x2f8a9f);
  nn_sockbase_stat_increment(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void nn_xreq_out (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xreq *xreq;
    struct nn_xreq_data *data;

    xreq = nn_cont (self, struct nn_xreq, sockbase);
    data = nn_pipe_getdata (pipe);
    nn_lb_out (&xreq->lb, &data->lb);

    nn_sockbase_stat_increment (self, NN_STAT_CURRENT_SND_PRIORITY,
        nn_lb_get_priority (&xreq->lb));
}